

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O0

int linenoise::getCursorPosition(int ifd,int ofd)

{
  int iVar1;
  ssize_t sVar2;
  uint local_44;
  undefined1 local_40 [4];
  uint i;
  int rows;
  int cols;
  char buf [32];
  int ofd_local;
  int ifd_local;
  
  local_44 = 0;
  buf._28_4_ = ofd;
  sVar2 = write(ofd,"\x1b[6n",4);
  if (sVar2 == 4) {
    for (; ((local_44 < 0x1f &&
            (sVar2 = read(ifd,(void *)((long)&rows + (ulong)local_44),1), sVar2 == 1)) &&
           (*(char *)((long)&rows + (ulong)local_44) != 'R')); local_44 = local_44 + 1) {
    }
    *(undefined1 *)((long)&rows + (ulong)local_44) = 0;
    if (((char)rows == '\x1b') && (rows._1_1_ == '[')) {
      iVar1 = __isoc99_sscanf((long)&rows + 2,"%d;%d",local_40,&i);
      if (iVar1 == 2) {
        ofd_local = i;
      }
      else {
        ofd_local = -1;
      }
    }
    else {
      ofd_local = -1;
    }
  }
  else {
    ofd_local = -1;
  }
  return ofd_local;
}

Assistant:

inline int getCursorPosition(int ifd, int ofd) {
    char buf[32];
    int cols, rows;
    unsigned int i = 0;

    /* Report cursor location */
    if (write(ofd, "\x1b[6n", 4) != 4) return -1;

    /* Read the response: ESC [ rows ; cols R */
    while (i < sizeof(buf)-1) {
        if (read(ifd,buf+i,1) != 1) break;
        if (buf[i] == 'R') break;
        i++;
    }
    buf[i] = '\0';

    /* Parse it. */
    if (buf[0] != ESC || buf[1] != '[') return -1;
    if (sscanf(buf+2,"%d;%d",&rows,&cols) != 2) return -1;
    return cols;
}